

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O3

Optional<llvm::object::SectionedAddress> * __thiscall
llvm::DWARFUnit::getAddrOffsetSectionItem
          (Optional<llvm::object::SectionedAddress> *__return_storage_ptr__,DWARFUnit *this,
          uint32_t Index)

{
  DWARFContext *this_00;
  uint uVar1;
  uint64_t uVar2;
  bool bVar3;
  undefined1 local_58 [8];
  DWARFDataExtractor DA;
  uint64_t Offset;
  
  if (this->IsDWO == true) {
    do {
      this_00 = this->Context;
      DWARFContext::parseNormalUnits(this_00);
      uVar1 = (this_00->NormalUnits).NumInfoUnits;
      if (uVar1 == 0xffffffff) {
        uVar1 = (this_00->NormalUnits).
                super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                .
                super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
                .
                super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                .
                super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                .super_SmallVectorBase.Size;
      }
    } while ((uVar1 == 1) &&
            (this = *(this_00->NormalUnits).
                     super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                     .
                     super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
                     .
                     super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                     .
                     super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                     .super_SmallVectorBase.BeginX, this->IsDWO != false));
  }
  DA.super_DataExtractor.Data.Length._1_1_ = (this->Header).FormParams.AddrSize;
  DA.Section = (DWARFSection *)
               (ulong)(Index * DA.super_DataExtractor.Data.Length._1_1_ +
                      this->AddrOffsetSectionBase);
  DA.Obj = (DWARFObject *)this->AddrOffsetSection;
  DA.super_DataExtractor.Data.Data = ((DA.Obj)->Dummy).Data.Data;
  bVar3 = (char *)((long)&((DA.Section)->Data).Data +
                  (ulong)DA.super_DataExtractor.Data.Length._1_1_) <=
          DA.super_DataExtractor.Data.Data;
  if (bVar3) {
    DA.super_DataExtractor._16_8_ =
         (this->Context->DObj)._M_t.
         super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
         .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
    DA.super_DataExtractor.Data.Length._0_1_ = this->isLittleEndian;
    local_58 = (undefined1  [8])((StringRef *)&(DA.Obj)->_vptr_DWARFObject)->Data;
    uVar2 = DWARFDataExtractor::getRelocatedValue
                      ((DWARFDataExtractor *)local_58,(uint)DA.super_DataExtractor.Data.Length._1_1_
                       ,(uint64_t *)&DA.Section,
                       &(__return_storage_ptr__->Storage).field_0.value.SectionIndex,(Error *)0x0);
    (__return_storage_ptr__->Storage).field_0.value.Address = uVar2;
  }
  else {
    (__return_storage_ptr__->Storage).field_0.empty = '\0';
  }
  (__return_storage_ptr__->Storage).hasVal = bVar3;
  return __return_storage_ptr__;
}

Assistant:

Optional<object::SectionedAddress>
DWARFUnit::getAddrOffsetSectionItem(uint32_t Index) const {
  if (IsDWO) {
    auto R = Context.info_section_units();
    auto I = R.begin();
    // Surprising if a DWO file has more than one skeleton unit in it - this
    // probably shouldn't be valid, but if a use case is found, here's where to
    // support it (probably have to linearly search for the matching skeleton CU
    // here)
    if (I != R.end() && std::next(I) == R.end())
      return (*I)->getAddrOffsetSectionItem(Index);
  }
  uint64_t Offset = AddrOffsetSectionBase + Index * getAddressByteSize();
  if (AddrOffsetSection->Data.size() < Offset + getAddressByteSize())
    return None;
  DWARFDataExtractor DA(Context.getDWARFObj(), *AddrOffsetSection,
                        isLittleEndian, getAddressByteSize());
  uint64_t Section;
  uint64_t Address = DA.getRelocatedAddress(&Offset, &Section);
  return {{Address, Section}};
}